

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleArrayHandling.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  Slice slice;
  ostream *poVar1;
  Builder *pBVar2;
  size_t i;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Slice f;
  ArrayIterator __begin1;
  Builder filtered;
  Builder b;
  Slice local_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  code *pcStack_1d0;
  uint8_t *local_1c0;
  ArrayIterator local_1b8;
  Builder local_198;
  Builder local_e0;
  
  arangodb::velocypack::Builder::Builder(&local_e0);
  arangodb::velocypack::Value::Value((Value *)&local_198,Array,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,(Value *)&local_198);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    local_198._buffer.
    super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_1_ = 0xc;
    local_198._buffer.
    super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._4_4_ = 4;
    pBVar2 = &local_198;
    local_198._buffer.
    super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
              (&local_e0,(Value *)&local_198);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&p_Var3->_vptr__Sp_counted_base + 1);
  } while (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa);
  arangodb::velocypack::Builder::close(&local_e0,(int)pBVar2);
  slice._start = arangodb::velocypack::Builder::start(&local_e0);
  local_1e8._M_unused._M_object = (void *)0x0;
  local_1e8._8_8_ = 0;
  pcStack_1d0 = std::
                _Function_handler<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleArrayHandling.cpp:24:29)>
                ::_M_invoke;
  local_1d8 = std::
              _Function_handler<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleArrayHandling.cpp:24:29)>
              ::_M_manager;
  arangodb::velocypack::Collection::filter(&local_198,slice,(Predicate *)&local_1e8);
  if (local_1d8 != (code *)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
  }
  if (local_198._pos == 0) {
    local_1f0._start = "";
  }
  else {
    local_1f0._start = arangodb::velocypack::Builder::start(&local_198);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Filtered length: ",0x11)
  ;
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_1f0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Iterating Array members:",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  arangodb::velocypack::ArrayIterator::ArrayIterator((ArrayIterator *)&local_1e8,local_1f0);
  local_1b8._size = (ValueLength)local_1d8;
  local_1b8._position = (ValueLength)pcStack_1d0;
  local_1b8._slice._start = (uint8_t *)local_1e8._M_unused._0_8_;
  local_1b8._current = (uint8_t *)local_1e8._8_8_;
  if (pcStack_1d0 != local_1d8) {
    do {
      local_1c0 = (uint8_t *)arangodb::velocypack::ArrayIterator::value(&local_1b8);
      poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,(Slice *)&local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", number value: ",0x10);
      arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
      getUInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_1c0);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      arangodb::velocypack::ArrayIterator::next(&local_1b8);
    } while (local_1b8._position != local_1b8._size);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Iterating some Array members using forEach:",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  local_1e8._M_unused._M_object = (void *)0x0;
  local_1e8._8_8_ = 0;
  pcStack_1d0 = std::
                _Function_handler<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleArrayHandling.cpp:45:26)>
                ::_M_invoke;
  local_1d8 = std::
              _Function_handler<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleArrayHandling.cpp:45:26)>
              ::_M_manager;
  arangodb::velocypack::Collection::forEach(local_1f0,(Predicate *)&local_1e8);
  if (local_1d8 != (code *)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
  }
  arangodb::velocypack::Builder::~Builder(&local_198);
  arangodb::velocypack::Builder::~Builder(&local_e0);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an array with 10 number members
  Builder b;

  b(Value(ValueType::Array));
  for (size_t i = 0; i < 10; ++i) {
    b.add(Value(i));
  }
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // filter out all array values less than 5
  Builder filtered =
      Collection::filter(s, [](Slice const& current, ValueLength) {
        if (current.getNumber<int>() < 5) {
          // exclude
          return false;
        }
        // include
        return true;
      });

  // print filtered array
  Slice f(filtered.slice());
  std::cout << "Filtered length: " << f.length() << std::endl;

  // now iterate over the (left over) array members
  std::cout << "Iterating Array members:" << std::endl;
  for (auto const& it : ArrayIterator(f)) {
    std::cout << it << ", number value: " << it.getUInt() << std::endl;
  }

  // iterate again, this time using Collection::forEach
  std::cout << "Iterating some Array members using forEach:" << std::endl;
  Collection::forEach(f, [](Slice const& current, ValueLength index) {
    std::cout << current << ", number value: " << current.getUInt()
              << std::endl;
    return (index != 2);  // stop after the 3rd element (indexes are 0-based)
  });

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}